

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Resize(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         *this)

{
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *pRVar1;
  int iVar2;
  code *pcVar3;
  uint size;
  Type pHVar4;
  Type TVar5;
  int *piVar6;
  undefined4 *puVar7;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *address;
  bool bVar8;
  uint uVar9;
  hash_t hVar10;
  EntryType *dst;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *pVVar11;
  int iVar12;
  ulong uVar13;
  bool zeroAllocate;
  long lVar14;
  size_t count;
  Type local_70;
  int *newBuckets;
  WeakType *local_60;
  ulong local_58;
  undefined4 *local_50;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *local_48;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *local_40;
  int local_38;
  uint local_34;
  int modIndex;
  
  size = this->count * 2;
  local_38 = 0x4b;
  uVar9 = 4;
  if (8 < size) {
    uVar9 = this->count & 0x7fffffff;
  }
  uVar9 = PrimePolicy::GetPrime(uVar9,&local_38);
  local_70.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  local_60 = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)0x0;
  local_34 = size;
  if (uVar9 == this->bucketCount) {
    dst = AllocateEntries((SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                           *)this->alloc,size,zeroAllocate);
    count = (size_t)(int)size;
    local_48 = Memory::Recycler::CreateWeakReferenceRegion<Js::JavascriptSymbol*>(this->alloc,count)
    ;
    local_40 = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)&this->entries;
    js_memcpy_s(dst,count * 8,(this->entries).ptr,(long)this->count << 3);
    if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015bf41c) == 1) {
      (*g_verifyIsNotBarrierAddress)(dst,count);
    }
    pRVar1 = local_48;
    Memory::
    CopyArray<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::Recycler>
              (local_48,count,(this->weakRefs).ptr,(long)this->count);
    address = local_40;
    Memory::Recycler::WBSetBit((char *)local_40);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
    Memory::Recycler::WBSetBit((char *)&this->weakRefs);
    (this->weakRefs).ptr = pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefs);
    this->size = local_34;
    this->modFunctionIndex = local_38;
  }
  else {
    local_48 = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)
               CONCAT44(local_48._4_4_,uVar9);
    Allocate(this,&local_70.ptr,(EntryType **)&newBuckets,&local_60,uVar9,size);
    piVar6 = newBuckets;
    TVar5.ptr = local_70.ptr;
    this->modFunctionIndex = local_38;
    this->count = 0;
    local_40 = local_60;
    if (this->bucketCount != 0) {
      local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar13 = 0;
      do {
        iVar12 = (this->buckets).ptr[uVar13];
        local_58 = uVar13;
        if (-1 < iVar12) {
          pVVar11 = (this->entries).ptr;
          do {
            if (pVVar11[iVar12].super_ValueEntryData<int>.next < -1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = local_50;
              *local_50 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                                 ,0x245,"(false)",
                                 "Following bucket chains should not result in free entries");
              if (!bVar8) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar7 = 0;
              break;
            }
            if ((this->weakRefs).ptr[iVar12].ptr != (Type)0x0) {
              hVar10 = PrimePolicy::ModPrime
                                 (pVVar11[iVar12].super_ValueEntryData<int>.value & 0x7fffffff,
                                  (uint)local_48,this->modFunctionIndex);
              lVar14 = (long)this->count;
              piVar6[lVar14 * 2 + 1] = TVar5.ptr[(int)hVar10];
              piVar6[lVar14 * 2] = (this->entries).ptr[iVar12].super_ValueEntryData<int>.value;
              pRVar1 = (this->weakRefs).ptr + iVar12;
              pHVar4 = pRVar1->heapBlock;
              local_40[lVar14].ptr = pRVar1->ptr;
              local_40[lVar14].heapBlock = pHVar4;
              iVar2 = this->count;
              TVar5.ptr[(int)hVar10] = iVar2;
              this->count = iVar2 + 1;
              pVVar11 = (this->entries).ptr;
            }
            iVar12 = pVVar11[iVar12].super_ValueEntryData<int>.next;
          } while (iVar12 != -1);
        }
        uVar13 = local_58 + 1;
      } while (uVar13 < this->bucketCount);
    }
    this->freeList = 0;
    this->freeCount = 0;
    Memory::Recycler::WBSetBit((char *)&this->buckets);
    (this->buckets).ptr = TVar5.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)piVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    Memory::Recycler::WBSetBit((char *)&this->weakRefs);
    (this->weakRefs).ptr = local_40;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefs);
    this->bucketCount = (uint)local_48;
    this->size = local_34;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);
            __analysis_assert(count > 1);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                newWeakRefs = AllocateWeakRefs(newSize);
                CopyArray<EntryType>(newEntries, newSize, entries, count);
                CopyArray<WeakType>(newWeakRefs, newSize, weakRefs, count); // TODO: concurrency issues?

                this->entries = newEntries;
                this->weakRefs = newWeakRefs;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, &newWeakRefs, newBucketCount, newSize);

            this->modFunctionIndex = modIndex;

            // Need to re-bucket the entries
            // Also need to account for whether the weak refs have been collected
            // Have to go in order so we can remove entries as appropriate
            this->count = 0;
            for (uint i = 0; i < this->bucketCount; ++i)
            {
                if (this->buckets[i] < 0)
                {
                    continue;
                }

                for (int currentEntry = this->buckets[i]; currentEntry != -1; )
                {
                    if (IsFreeEntry(entries[currentEntry]))
                    {
                        // Entry is free; this shouldn't happen, but stop following the chain
                        AssertMsg(false, "Following bucket chains should not result in free entries");
                        break;
                    }
                    if (this->weakRefs[currentEntry] == nullptr)
                    {
                        // The weak ref has been collected; don't bother bringing it to the new collection
                        currentEntry = this->entries[currentEntry].next;
                        continue;
                    }

                    hash_t hashCode = GetHashCodeWithKey<TBKey>(this->GetKey(currentEntry));
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[count].next = newBuckets[bucket];
                    newEntries[count].SetValue(this->entries[currentEntry].Value());
                    newWeakRefs[count] = this->weakRefs[currentEntry];
                    newBuckets[bucket] = count;
                    ++count;

                    currentEntry = this->entries[currentEntry].next;
                }
            }
            this->freeCount = 0;
            this->freeList = 0;
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = newBucketCount;
            this->size = newSize;

        }